

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry.h
# Opt level: O1

void google::protobuf::internal::
     MapEntry<unsigned_int,_google::protobuf::Message,_(google::protobuf::internal::WireFormatLite::FieldType)7,_(google::protobuf::internal::WireFormatLite::FieldType)11>
     ::SharedDtor(MessageLite *msg)

{
  if (((msg->_internal_metadata_).ptr_ & 1) != 0) {
    InternalMetadata::DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>
              (&msg->_internal_metadata_);
  }
  if (msg[2]._vptr_MessageLite != (_func_int **)0x0) {
    (**(code **)(*msg[2]._vptr_MessageLite + 8))();
    return;
  }
  return;
}

Assistant:

static void SharedDtor(MessageLite& msg) {
    auto& this_ = static_cast<MapEntry&>(msg);
    this_._internal_metadata_.template Delete<UnknownFieldSet>();
    KeyTypeHandler::DeleteNoArena(this_._impl_.key_);
    ValueTypeHandler::DeleteNoArena(this_._impl_.value_);
  }